

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,std::hash<wasm::
HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>,(wasm::Mutability)0,wasm::
ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::
Function*,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::
HeapType>,std::allocator<wasm::HeapType>>&)>)::Mapper::doWalkFunction(wasm::Function__
          (void *this,Function *curr)

{
  Function *__args;
  size_type sVar1;
  mapped_type *__args_1;
  Function *local_20;
  Function *curr_local;
  
  local_20 = curr;
  sVar1 = std::
          map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
          ::count(*(map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
                    **)((long)this + 0x110),&local_20);
  __args = local_20;
  if (sVar1 != 0) {
    __args_1 = std::
               map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator[](*(map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
                              **)((long)this + 0x110),&local_20);
    std::
    function<void_(wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_&)>
    ::operator()((function<void_(wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_&)>
                  *)((long)this + 0x118),__args,__args_1);
    return;
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h"
                ,0x192,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType>>::ParallelFunctionAnalysis(Module &, Func)::Mapper::doWalkFunction(Function *) [T = std::unordered_set<wasm::HeapType>, Mut = wasm::Immutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }